

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionHandler.cpp
# Opt level: O2

bool __thiscall Shell::InductionTemplate::checkWellFoundedness(InductionTemplate *this)

{
  pointer pBVar1;
  pointer ppTVar2;
  Signature *this_00;
  bool bVar3;
  TermList sort;
  ulong *puVar4;
  ulong uVar5;
  uint i;
  pointer ppTVar6;
  ulong __n;
  int iVar7;
  pointer pBVar8;
  reference rVar9;
  vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
  relatedTerms;
  _Vector_base<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
  local_58;
  pair<Kernel::Term_*,_Kernel::Term_*> local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar1 = (this->_branches).
           super__Vector_base<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pBVar8 = (this->_branches).
                super__Vector_base<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>
                ._M_impl.super__Vector_impl_data._M_start; pBVar8 != pBVar1; pBVar8 = pBVar8 + 1) {
    ppTVar2 = (pBVar8->_recursiveCalls).
              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar6 = (pBVar8->_recursiveCalls).
                   super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppTVar6 != ppTVar2; ppTVar6 = ppTVar6 + 1) {
      local_40.first = pBVar8->_header;
      local_40.second = *ppTVar6;
      std::
      vector<std::pair<Kernel::Term*,Kernel::Term*>,std::allocator<std::pair<Kernel::Term*,Kernel::Term*>>>
      ::emplace_back<std::pair<Kernel::Term*,Kernel::Term*>>
                ((vector<std::pair<Kernel::Term*,Kernel::Term*>,std::allocator<std::pair<Kernel::Term*,Kernel::Term*>>>
                  *)&local_58,&local_40);
      iVar7 = 0;
      for (__n = 0; this_00 = DAT_00a14190, __n < this->_arity; __n = __n + 1) {
        sort = Kernel::OperatorType::arg(this->_type,(uint)__n);
        bVar3 = Kernel::Signature::isTermAlgebraSort(this_00,sort);
        if (bVar3) {
          rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->_indPos,__n);
          bVar3 = true;
          if ((*rVar9._M_p & rVar9._M_mask) == 0) {
            bVar3 = pBVar8->_header->_args
                    [(int)((*(uint *)&pBVar8->_header->field_0xc & 0xfffffff) + iVar7)]._content !=
                    (*ppTVar6)->_args[(int)((*(uint *)&(*ppTVar6)->field_0xc & 0xfffffff) + iVar7)].
                    _content;
          }
          rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->_indPos,__n);
          puVar4 = rVar9._M_p;
          if (bVar3) {
            uVar5 = rVar9._M_mask | *puVar4;
          }
          else {
            uVar5 = ~rVar9._M_mask & *puVar4;
          }
          *puVar4 = uVar5;
        }
        iVar7 = iVar7 + -1;
      }
    }
  }
  bVar3 = InductionPreprocessor::checkWellFoundedness
                    ((vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
                      *)&local_58);
  std::
  _Vector_base<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
  ::~_Vector_base(&local_58);
  return bVar3;
}

Assistant:

bool InductionTemplate::checkWellFoundedness()
{
  std::vector<pair<Term*, Term*>> relatedTerms;
  for (auto& b : _branches) {
    for (auto& r : b._recursiveCalls) {
      relatedTerms.push_back(make_pair(b._header, r));

      // fill in bit vector of induction variables
      for (unsigned i = 0; i < _arity; i++) {
        if (env.signature->isTermAlgebraSort(_type->arg(i))) {
          _indPos[i] = _indPos[i] || (*b._header->nthArgument(i) != *r->nthArgument(i));
        }
      }
    }
  }
  return InductionPreprocessor::checkWellFoundedness(relatedTerms);
}